

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependanceestimator.cxx
# Opt level: O0

int __thiscall DependanceEstimator::init(DependanceEstimator *this,EVP_PKEY_CTX *ctx)

{
  double dVar1;
  int local_2c;
  uint local_28;
  int j;
  int i_4;
  int distBins;
  int i_3;
  int i_2;
  int i_1;
  int i;
  DependanceEstimator *this_local;
  
  (this->super_Estimator).nSamples = 0;
  for (i_2 = 0; i_2 < this->dependanceBins; i_2 = i_2 + 1) {
    this->aSamples[i_2] = 0.0;
  }
  if (((this->super_Estimator).nEstimate & 4U) != 0) {
    for (i_3 = 0; i_3 < this->dependanceBins; i_3 = i_3 + 1) {
      this->aOne[i_3] = 0.0;
    }
  }
  if (((this->super_Estimator).nEstimate & 8U) != 0) {
    for (distBins = 0; distBins < this->dependanceBins; distBins = distBins + 1) {
      this->aTwo[distBins] = 0.0;
    }
  }
  if (((this->super_Estimator).nEstimate & 0x10U) != 0) {
    for (i_4 = 0; i_4 < this->dependanceBins; i_4 = i_4 + 1) {
      this->aThree[i_4] = 0.0;
    }
  }
  local_28 = (this->super_Estimator).nEstimate & 2;
  if (local_28 != 0) {
    dVar1 = ceil((this->dDistEnd - this->dDistBegin) / this->dDistDelta);
    for (local_28 = 0; (int)local_28 < this->dependanceBins; local_28 = local_28 + 1) {
      for (local_2c = 0; local_2c < (int)dVar1; local_2c = local_2c + 1) {
        this->aDist[(int)local_28][local_2c] = 0.0;
      }
    }
  }
  return local_28;
}

Assistant:

void DependanceEstimator::init()
{
	nSamples = 0;
	for(int i=0; i<dependanceBins; i++)
		aSamples[i] = 0.0;
	if(nEstimate & EST_MEAN)
		for(int i=0; i<dependanceBins; i++)
			aOne[i] = 0.0;
	if(nEstimate & EST_VAR)
		for(int i=0; i<dependanceBins; i++)
			aTwo[i] = 0.0;
	if(nEstimate & EST_CUR)
		for(int i=0; i<dependanceBins; i++)
			aThree[i] = 0.0;
	if(nEstimate & EST_DENS) {
		int distBins = int(ceil((dDistEnd - dDistBegin) / dDistDelta));
		for( int i=0; i<dependanceBins; i++ )
			for( int j=0; j<distBins; j++ )
				aDist[i][j] = 0.0;
	}
}